

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O2

uchar pseudo_median<unsigned_char>(uchar **strings,size_t N,size_t depth)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar c;
  ulong uVar5;
  
  uVar1 = get_char<unsigned_char>(*strings,depth);
  if (N < 0x1f) {
    uVar2 = get_char<unsigned_char>(*(uchar **)((long)strings + (N & 0xfffffffffffffffe) * 4),depth)
    ;
    uVar3 = get_char<unsigned_char>(strings[N - 1],depth);
  }
  else {
    uVar2 = get_char<unsigned_char>(strings[1],depth);
    uVar3 = get_char<unsigned_char>(strings[2],depth);
    uVar1 = med3char<unsigned_char>(uVar1,uVar2,uVar3);
    uVar5 = N & 0xfffffffffffffffe;
    uVar2 = get_char<unsigned_char>(*(uchar **)((long)strings + uVar5 * 4),depth);
    uVar3 = get_char<unsigned_char>(*(uchar **)((long)strings + uVar5 * 4 + 8),depth);
    uVar4 = get_char<unsigned_char>(*(uchar **)((long)strings + uVar5 * 4 + 0x10),depth);
    uVar2 = med3char<unsigned_char>(uVar2,uVar3,uVar4);
    uVar3 = get_char<unsigned_char>(strings[N - 3],depth);
    uVar4 = get_char<unsigned_char>(strings[N - 2],depth);
    c = get_char<unsigned_char>(strings[N - 1],depth);
    uVar3 = med3char<unsigned_char>(uVar3,uVar4,c);
  }
  uVar1 = med3char<unsigned_char>(uVar1,uVar2,uVar3);
  return uVar1;
}

Assistant:

CharT
pseudo_median(unsigned char** strings, size_t N, size_t depth)
{
	if (N > 30)
		return med3char(
			med3char(
				get_char<CharT>(strings[0], depth),
				get_char<CharT>(strings[1], depth),
				get_char<CharT>(strings[2], depth)
				),
			med3char(
				get_char<CharT>(strings[N/2  ], depth),
				get_char<CharT>(strings[N/2+1], depth),
				get_char<CharT>(strings[N/2+2], depth)
				),
			med3char(
				get_char<CharT>(strings[N-3], depth),
				get_char<CharT>(strings[N-2], depth),
				get_char<CharT>(strings[N-1], depth)
				)
		       );
	else
		return med3char(get_char<CharT>(strings[0  ], depth),
				get_char<CharT>(strings[N/2], depth),
				get_char<CharT>(strings[N-1], depth));
}